

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

void addquoted(luaL_Buffer *b,char *s,size_t len)

{
  char cVar1;
  size_t sVar2;
  ushort **ppuVar3;
  long lVar4;
  char local_2a [8];
  char buff [10];
  size_t len_local;
  char *s_local;
  luaL_Buffer *b_local;
  
  buff._2_8_ = len;
  if (b->size <= b->n) {
    luaL_prepbuffsize(b,1);
  }
  sVar2 = b->n;
  b->n = sVar2 + 1;
  b->b[sVar2] = '\"';
  len_local = (size_t)s;
  while (lVar4 = buff._2_8_ + -1, buff._2_8_ != 0) {
    if (((*(char *)len_local == '\"') || (*(char *)len_local == '\\')) ||
       (*(char *)len_local == '\n')) {
      buff._2_8_ = lVar4;
      if (b->size <= b->n) {
        luaL_prepbuffsize(b,1);
      }
      sVar2 = b->n;
      b->n = sVar2 + 1;
      b->b[sVar2] = '\\';
      if (b->size <= b->n) {
        luaL_prepbuffsize(b,1);
      }
      cVar1 = *(char *)len_local;
      sVar2 = b->n;
      b->n = sVar2 + 1;
      b->b[sVar2] = cVar1;
    }
    else {
      buff._2_8_ = lVar4;
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)(uint)*(byte *)len_local] & 2) == 0) {
        if (b->size <= b->n) {
          luaL_prepbuffsize(b,1);
        }
        cVar1 = *(char *)len_local;
        sVar2 = b->n;
        b->n = sVar2 + 1;
        b->b[sVar2] = cVar1;
      }
      else {
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)(uint)*(byte *)(len_local + 1)] & 0x800) == 0) {
          snprintf(local_2a,10,"\\%d",(ulong)*(byte *)len_local);
        }
        else {
          snprintf(local_2a,10,"\\%03d",(ulong)*(byte *)len_local);
        }
        luaL_addstring(b,local_2a);
      }
    }
    len_local = len_local + 1;
  }
  if (b->size <= b->n) {
    buff._2_8_ = lVar4;
    luaL_prepbuffsize(b,1);
  }
  sVar2 = b->n;
  b->n = sVar2 + 1;
  b->b[sVar2] = '\"';
  return;
}

Assistant:

static void addquoted (luaL_Buffer *b, const char *s, size_t len) {
  luaL_addchar(b, '"');
  while (len--) {
    if (*s == '"' || *s == '\\' || *s == '\n') {
      luaL_addchar(b, '\\');
      luaL_addchar(b, *s);
    }
    else if (iscntrl(uchar(*s))) {
      char buff[10];
      if (!isdigit(uchar(*(s+1))))
        l_sprintf(buff, sizeof(buff), "\\%d", (int)uchar(*s));
      else
        l_sprintf(buff, sizeof(buff), "\\%03d", (int)uchar(*s));
      luaL_addstring(b, buff);
    }
    else
      luaL_addchar(b, *s);
    s++;
  }
  luaL_addchar(b, '"');
}